

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O3

qsizetype lastIndexof_helper<QStringView>
                    (QStringList *that,QStringView needle,qsizetype from,CaseSensitivity cs)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  qsizetype *pqVar5;
  QStringView rhs;
  
  uVar1 = (that->d).size;
  lVar4 = from;
  if (((-1 < from) && (lVar4 = -1, (ulong)from < uVar1)) || (from = uVar1 + lVar4, -1 < from)) {
    pqVar5 = &(that->d).ptr[from].d.size;
    do {
      rhs.m_data = (char16_t *)pqVar5[-1];
      rhs.m_size = *pqVar5;
      iVar3 = QtPrivate::compareStrings(needle,rhs,cs);
      if (iVar3 == 0) {
        return from;
      }
      pqVar5 = pqVar5 + -3;
      bVar2 = 0 < from;
      from = from + -1;
    } while (bVar2);
  }
  return -1;
}

Assistant:

qsizetype lastIndexof_helper(const QStringList &that, String needle, qsizetype from,
                             Qt::CaseSensitivity cs)
{
    if (from < 0)
        from += that.size();
    else if (from >= that.size())
        from = that.size() - 1;

     for (qsizetype i = from; i >= 0; --i) {
        if (needle.compare(that.at(i), cs) == 0)
            return i;
    }

    return -1;
}